

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestBuildHandler::FragmentCompare::operator()(FragmentCompare *this,string *l,string *r)

{
  bool bVar1;
  int result;
  int local_1c;
  
  bVar1 = cmFileTimeComparison::FileTimeCompare
                    (this->FTC,(l->_M_dataplus)._M_p,(r->_M_dataplus)._M_p,&local_1c);
  if (!bVar1 || local_1c == 0) {
    local_1c = std::__cxx11::string::compare((string *)l);
  }
  return SUB41((uint)local_1c >> 0x1f,0);
}

Assistant:

bool operator()(std::string const& l, std::string const& r)
    {
    // Order files by modification time.  Use lexicographic order
    // among files with the same time.
    int result;
    if(this->FTC->FileTimeCompare(l.c_str(), r.c_str(), &result) &&
       result != 0)
      {
      return result < 0;
      }
    else
      {
      return l < r;
      }
    }